

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_c0;
  TPZQuadraticPrism local_a0;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_c0);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xc]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xc]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xd]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xd]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[10]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[10]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xb]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xb]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[8]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[8]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[9]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[9]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[6]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[6]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[7]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[7]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[4]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[4]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[5]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[5]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[2]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[2]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[3]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[3]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.fNodeIndexes[0xe] = -1;
  local_a0.super_TPZNodeRep<15,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadraticPrism_018a3360;
  iVar3 = pzgeom::TPZQuadraticPrism::ClassId(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}